

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesLongMessageForm.cxx
# Opt level: O0

void __thiscall
cmCursesLongMessageForm::Render
          (cmCursesLongMessageForm *this,int param_1,int param_2,int param_3,int param_4)

{
  long lVar1;
  FIELD *pFVar2;
  FORM *pFVar3;
  int local_5c;
  int local_48;
  int local_44;
  int local_34;
  int i;
  char *msg;
  int y;
  int x;
  int param_4_local;
  int param_3_local;
  int param_2_local;
  int param_1_local;
  cmCursesLongMessageForm *this_local;
  
  if (_stdscr == 0) {
    local_44 = -1;
    local_48 = -1;
  }
  else {
    local_44 = *(short *)(_stdscr + 4) + 1;
    local_48 = *(short *)(_stdscr + 6) + 1;
  }
  if ((this->super_cmCursesForm).Form != (FORM *)0x0) {
    unpost_form((this->super_cmCursesForm).Form);
    free_form((this->super_cmCursesForm).Form);
    (this->super_cmCursesForm).Form = (FORM *)0x0;
  }
  lVar1 = std::__cxx11::string::c_str();
  curses_clear();
  if (this->Fields[0] != (FIELD *)0x0) {
    free_field(this->Fields[0]);
    this->Fields[0] = (FIELD *)0x0;
  }
  pFVar2 = new_field(local_44 + -6,local_48 + -2,1,1,0,0);
  this->Fields[0] = pFVar2;
  field_opts_off(this->Fields[0],0x200);
  pFVar3 = new_form(this->Fields);
  (this->super_cmCursesForm).Form = pFVar3;
  post_form((this->super_cmCursesForm).Form);
  local_34 = 0;
  form_driver((this->super_cmCursesForm).Form,0x216);
  for (; *(char *)(lVar1 + local_34) != '\0' && local_34 < 60000; local_34 = local_34 + 1) {
    if ((*(char *)(lVar1 + local_34) == '\n') && (*(char *)(lVar1 + (local_34 + 1)) != '\0')) {
      form_driver((this->super_cmCursesForm).Form,0x21e);
    }
    else {
      form_driver((this->super_cmCursesForm).Form,(int)*(char *)(lVar1 + local_34));
    }
  }
  form_driver((this->super_cmCursesForm).Form,0x216);
  (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])();
  PrintKeys(this);
  if (_stdscr == 0) {
    local_5c = -1;
  }
  else {
    local_5c = *(short *)(_stdscr + 4) + 1;
  }
  wtouchln(_stdscr,0,local_5c,1);
  refresh();
  return;
}

Assistant:

void cmCursesLongMessageForm::Render(int /*left*/, int /*top*/, int /*width*/,
                                     int /*height*/)
{
  int x, y;
  getmaxyx(stdscr, y, x);

  if (this->Form) {
    unpost_form(this->Form);
    free_form(this->Form);
    this->Form = nullptr;
  }

  const char* msg = this->Messages.c_str();

  curses_clear();

  if (this->Fields[0]) {
    free_field(this->Fields[0]);
    this->Fields[0] = nullptr;
  }

  this->Fields[0] = new_field(y - 6, x - 2, 1, 1, 0, 0);

  field_opts_off(this->Fields[0], O_STATIC);

  this->Form = new_form(this->Fields);
  post_form(this->Form);

  int i = 0;
  form_driver(this->Form, REQ_BEG_FIELD);
  while (msg[i] != '\0' && i < 60000) {
    if (msg[i] == '\n' && msg[i + 1] != '\0') {
      form_driver(this->Form, REQ_NEW_LINE);
    } else {
      form_driver(this->Form, msg[i]);
    }
    i++;
  }
  form_driver(this->Form, REQ_BEG_FIELD);

  this->UpdateStatusBar();
  this->PrintKeys();
  touchwin(stdscr);
  refresh();
}